

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPTCPTransmitter::DeleteTransmissionInfo(RTPTCPTransmitter *this,RTPTransmissionInfo *i)

{
  if (this->m_init == true) {
    RTPDelete<jrtplib::RTPTransmissionInfo>
              (i,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
    return;
  }
  return;
}

Assistant:

void RTPTCPTransmitter::DeleteTransmissionInfo(RTPTransmissionInfo *i)
{
	if (!m_init)
		return;

	RTPDelete(i, GetMemoryManager());
}